

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# our_gl.cpp
# Opt level: O1

mat4 * viewport(mat4 *__return_storage_ptr__,int x,int y,int w,int h)

{
  float fVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  float fVar7;
  double dVar8;
  
  __return_storage_ptr__->rows[3].data[2] = 0.0;
  __return_storage_ptr__->rows[3].data[3] = 0.0;
  __return_storage_ptr__->rows[3].data[0] = 0.0;
  __return_storage_ptr__->rows[3].data[1] = 0.0;
  __return_storage_ptr__->rows[2].data[2] = 0.0;
  __return_storage_ptr__->rows[2].data[3] = 0.0;
  __return_storage_ptr__->rows[2].data[0] = 0.0;
  __return_storage_ptr__->rows[2].data[1] = 0.0;
  __return_storage_ptr__->rows[1].data[2] = 0.0;
  __return_storage_ptr__->rows[1].data[3] = 0.0;
  __return_storage_ptr__->rows[1].data[0] = 0.0;
  __return_storage_ptr__->rows[1].data[1] = 0.0;
  __return_storage_ptr__->rows[0].data[2] = 0.0;
  __return_storage_ptr__->rows[0].data[3] = 0.0;
  __return_storage_ptr__->rows[0].data[0] = 0.0;
  __return_storage_ptr__->rows[0].data[1] = 0.0;
  pdVar2 = __return_storage_ptr__->rows[3].data + 3;
  lVar3 = 3;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      dVar8 = 1.0;
      if (lVar4 != lVar5) {
        dVar8 = 0.0;
      }
      pdVar2[lVar5] = dVar8;
      fVar1 = DAT_00108350;
      lVar5 = lVar5 + -1;
    } while (lVar5 != -4);
    pdVar2 = pdVar2 + -4;
    lVar4 = lVar4 + -1;
    bVar6 = lVar3 != 0;
    lVar3 = lVar3 + -1;
  } while (bVar6);
  fVar7 = (float)w * DAT_00108350;
  __return_storage_ptr__->rows[0].data[3] = (double)((float)x + fVar7);
  __return_storage_ptr__->rows[1].data[3] = (double)((float)y + (float)h * fVar1);
  __return_storage_ptr__->rows[2].data[3] = 127.5;
  __return_storage_ptr__->rows[0].data[0] = (double)fVar7;
  __return_storage_ptr__->rows[1].data[1] = (double)((float)h * fVar1);
  __return_storage_ptr__->rows[2].data[2] = 127.5;
  return __return_storage_ptr__;
}

Assistant:

mat4 viewport(int x, int y, int w, int h)
{
    mat4 Viewport = mat4::identity();
    Viewport[0][3] = x + w / 2.f;
    Viewport[1][3] = y + h / 2.f;
    Viewport[2][3] = 255.f / 2.f;
    Viewport[0][0] = w / 2.f;
    Viewport[1][1] = h / 2.f;
    Viewport[2][2] = 255.f / 2.f;
    return Viewport;
}